

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

void __thiscall DActiveButton::DActiveButton(DActiveButton *this)

{
  TVector2<double> local_30 [2];
  DActiveButton *local_10;
  DActiveButton *this_local;
  
  local_10 = this;
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009fb5a8;
  TVector2<double>::TVector2(&this->m_Pos);
  this->m_Side = (side_t *)0x0;
  this->m_Part = -1;
  this->m_SwitchDef = (FSwitchDef *)0x0;
  this->m_Timer = 0;
  TVector2<double>::TVector2(local_30,0.0,0.0);
  TVector2<double>::operator=(&this->m_Pos,local_30);
  this->bFlippable = false;
  this->bReturning = false;
  this->m_Frame = 0;
  return;
}

Assistant:

DActiveButton::DActiveButton ()
{
	m_Side = NULL;
	m_Part = -1;
	m_SwitchDef = 0;
	m_Timer = 0;
	m_Pos = { 0,0 };
	bFlippable = false;
	bReturning = false;
	m_Frame = 0;
}